

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::RandSequenceStatement::fromSyntax
          (Compilation *comp,RandSequenceStatementSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  SourceLocation SVar3;
  undefined4 extraout_var;
  RandSequenceStatement *pRVar4;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> extraout_RDX;
  SourceLocation extraout_RDX_00;
  SourceLocation extraout_RDX_01;
  SourceLocation extraout_RDX_02;
  RandSeqProductionSymbol *prod;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  sVar6;
  SourceRange SVar7;
  string_view name;
  RandSeqProductionSymbol *firstProd;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> productions;
  RandSeqProductionSymbol *local_e0;
  Compilation *local_d8;
  SourceRange local_d0;
  undefined1 local_c0 [64];
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*> local_80 [2];
  SourceRange local_40;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> sVar2;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> sVar5;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  local_d8 = comp;
  sVar6 = Scope::membersOfType<slang::ast::RandSeqProductionSymbol>((context->scope).ptr);
  sVar5 = sVar6._M_end.current;
  sVar2 = sVar6._M_begin.current;
  if (sVar2.current != sVar5.current) {
    do {
      local_c0._0_8_ = sVar2.current;
      SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*> *)local_80,
                 (RandSeqProductionSymbol **)local_c0);
      do {
        sVar2.current = ((Symbol *)&(sVar2.current)->kind)->nextInScope;
        sVar6._M_end.current = extraout_RDX.current;
        sVar6._M_begin.current = sVar2.current;
        if (sVar2.current == (Symbol *)0x0) break;
      } while ((sVar2.current)->kind != RandSeqProduction);
    } while (sVar2.current != sVar5.current);
  }
  sVar2 = sVar6._M_end.current;
  local_e0 = (RandSeqProductionSymbol *)0x0;
  if ((syntax->firstProduction).info == (Info *)0x0) {
    if (local_80[0].len == 0) {
      SVar7 = (SourceRange)ZEXT816(0);
    }
    else {
      local_e0 = *local_80[0].data_;
      SVar3 = parsing::Token::location(&syntax->randsequence);
      SVar7 = parsing::Token::range(&syntax->closeParen);
      sVar2.current = (Symbol *)SVar7.endLoc;
      SVar7.endLoc = (SourceLocation)sVar2.current;
      SVar7.startLoc = SVar3;
    }
  }
  else {
    SVar7 = parsing::Token::range(&syntax->firstProduction);
    name = parsing::Token::valueText(&syntax->firstProduction);
    local_e0 = RandSeqProductionSymbol::findProduction(name,SVar7,context);
    sVar2.current = (Symbol *)extraout_RDX_00;
  }
  if (local_e0 != (RandSeqProductionSymbol *)0x0) {
    local_c0._8_8_ = 0;
    local_c0._16_8_ = 5;
    local_d0 = SVar7;
    local_c0._0_8_ = (RandSeqProductionSymbol *)(local_c0 + 0x18);
    CallExpression::bindArgs
              ((ArgumentListSyntax *)0x0,local_e0->arguments,(local_e0->super_Symbol).name,SVar7,
               context,(SmallVectorBase<const_slang::ast::Expression_*> *)local_c0,false);
    sVar2.current = (Symbol *)extraout_RDX_01;
    if ((RandSeqProductionSymbol *)local_c0._0_8_ != (RandSeqProductionSymbol *)(local_c0 + 0x18)) {
      operator_delete((void *)local_c0._0_8_);
      sVar2.current = (Symbol *)extraout_RDX_02;
    }
  }
  this = local_d8;
  iVar1 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::copy
                    (local_80,(EVP_PKEY_CTX *)local_d8,(EVP_PKEY_CTX *)sVar2.current);
  local_c0._0_8_ = CONCAT44(extraout_var,iVar1);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pRVar4 = BumpAllocator::
           emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,std::span<slang::ast::RandSeqProductionSymbol_const*,18446744073709551615ul>,slang::SourceRange>
                     (&this->super_BumpAllocator,&local_e0,
                      (span<const_slang::ast::RandSeqProductionSymbol_*,_18446744073709551615UL> *)
                      local_c0,&local_40);
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &pRVar4->super_Statement;
}

Assistant:

Statement& RandSequenceStatement::fromSyntax(Compilation& comp,
                                             const RandSequenceStatementSyntax& syntax,
                                             const ASTContext& context) {
    SmallVector<const RandSeqProductionSymbol*> productions;
    for (auto& prod : context.scope->membersOfType<RandSeqProductionSymbol>())
        productions.push_back(&prod);

    SourceRange firstProdRange;
    const RandSeqProductionSymbol* firstProd = nullptr;
    if (syntax.firstProduction) {
        firstProdRange = syntax.firstProduction.range();
        firstProd = RandSeqProductionSymbol::findProduction(syntax.firstProduction.valueText(),
                                                            firstProdRange, context);
    }
    else if (!productions.empty()) {
        firstProd = productions[0];
        firstProdRange = {syntax.randsequence.location(), syntax.closeParen.range().end()};
    }

    if (firstProd) {
        // Make sure the first production doesn't require arguments.
        SmallVector<const Expression*> args;
        CallExpression::bindArgs(nullptr, firstProd->arguments, firstProd->name, firstProdRange,
                                 context, args, /* isBuiltInMethod */ false);
    }

    // All of the logic for creating productions is in the RandSeqProduction symbol.
    return *comp.emplace<RandSequenceStatement>(firstProd, productions.copy(comp),
                                                syntax.sourceRange());
}